

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-storage.c
# Opt level: O2

void ndn_key_storage_delete_ecc_key(uint32_t key_id)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  long lVar3;
  uint32_t *puVar4;
  long lVar5;
  
  puVar4 = &storage.ecc_pub_keys[9].key_id;
  lVar3 = -0x344;
  do {
    lVar5 = lVar3;
    if (lVar5 + 0x4c == 0) {
      return;
    }
    puVar4 = puVar4 + 0xb;
    uVar2 = *(uint32_t *)(storage.ecc_prv_keys[3].abs_key.key_value + lVar5 + 0xc);
    lVar3 = lVar5 + 0x4c;
  } while (uVar2 != key_id || uVar2 == 0xffffffff);
  puVar1 = storage.ecc_prv_keys[3].abs_key.key_value + lVar5 + 0xc;
  puVar1[0] = 0xff;
  puVar1[1] = 0xff;
  puVar1[2] = 0xff;
  puVar1[3] = 0xff;
  *puVar4 = 0xffffffff;
  return;
}

Assistant:

void
ndn_key_storage_delete_ecc_key(uint32_t key_id)
{
  for (uint8_t i = 0; i < NDN_SEC_SIGNING_KEYS_SIZE; i++) {
    if (storage.ecc_pub_keys[i].key_id != NDN_SEC_INVALID_KEY_ID) {
      if (key_id == storage.ecc_pub_keys[i].key_id) {
        storage.ecc_pub_keys[i].key_id = NDN_SEC_INVALID_KEY_ID;
        storage.ecc_prv_keys[i].key_id = NDN_SEC_INVALID_KEY_ID;
        return;
      }
    }
  }
}